

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

int __thiscall
HModel::util_chgRowBoundsSet
          (HModel *this,int nrows,int *XrowBoundIndex,double *XrowLowerValues,
          double *XrowUpperValues)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  HModel *in_RDI;
  long in_R8;
  double upper;
  double lower;
  int row;
  int ix;
  int in_stack_ffffffffffffff7c;
  HModel *in_stack_ffffffffffffff80;
  HModel *local_70;
  double local_58;
  int local_34;
  
  local_34 = 0;
  while( true ) {
    if (in_ESI <= local_34) {
      mlFg_Update(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      return 0;
    }
    iVar1 = *(int *)(in_RDX + (long)local_34 * 4);
    local_58 = *(double *)(in_RCX + (long)local_34 * 8);
    local_70 = *(HModel **)(in_R8 + (long)local_34 * 8);
    bVar2 = hsol_isInfinity(in_RDI,local_58);
    if (bVar2) break;
    bVar2 = hsol_isInfinity(in_RDI,-(double)local_70);
    if (bVar2) {
      return -(iVar1 + 1);
    }
    bVar2 = hsol_isInfinity(in_RDI,-local_58);
    if (!bVar2) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->rowScale,(long)iVar1);
      local_58 = local_58 / *pvVar3;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->rowLower,(long)iVar1)
    ;
    *pvVar3 = local_58;
    bVar2 = hsol_isInfinity(in_RDI,(double)local_70);
    if (!bVar2) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->rowScale,(long)iVar1);
      local_70 = (HModel *)((double)local_70 / *pvVar3);
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->rowUpper,(long)iVar1)
    ;
    *pvVar3 = (value_type)local_70;
    local_34 = local_34 + 1;
    in_stack_ffffffffffffff80 = local_70;
  }
  return iVar1 + 1;
}

Assistant:

int HModel::util_chgRowBoundsSet(int nrows, const int* XrowBoundIndex, const double* XrowLowerValues, const double* XrowUpperValues) {
  assert(XrowBoundIndex != NULL);
  assert(XrowLowerValues != NULL);
  assert(XrowUpperValues != NULL);
  for (int ix = 0; ix < nrows; ++ix) {
    int row = XrowBoundIndex[ix];
    assert(0 <= row);
    assert(row < numRow);
    double lower = XrowLowerValues[ix];
    double upper = XrowUpperValues[ix];
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(lower)) return row+1;
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(-upper)) return -(row+1);
    rowLower[row] = (hsol_isInfinity(-lower) ? lower : lower / rowScale[row]);
    rowUpper[row] = (hsol_isInfinity( upper) ? upper : upper / rowScale[row]);
    //    printf("Bounds for row %2d are now [%11g, %11g]\n", row, rowLower[row], rowUpper[row]);
  }
  //Deduce the consequences of new bounds
  mlFg_Update(mlFg_action_NewBounds);
  return 0;  
}